

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2c8643::BumpPointerAllocator::reset(BumpPointerAllocator *this)

{
  BumpPointerAllocator *__ptr;
  
  while (__ptr = (BumpPointerAllocator *)this->BlockList, __ptr != (BumpPointerAllocator *)0x0) {
    this->BlockList = *(BlockMeta **)__ptr->InitialBuffer;
    if (__ptr != this) {
      free(__ptr);
    }
  }
  this->InitialBuffer[0] = '\0';
  this->InitialBuffer[1] = '\0';
  this->InitialBuffer[2] = '\0';
  this->InitialBuffer[3] = '\0';
  this->InitialBuffer[4] = '\0';
  this->InitialBuffer[5] = '\0';
  this->InitialBuffer[6] = '\0';
  this->InitialBuffer[7] = '\0';
  this->InitialBuffer[8] = '\0';
  this->InitialBuffer[9] = '\0';
  this->InitialBuffer[10] = '\0';
  this->InitialBuffer[0xb] = '\0';
  this->InitialBuffer[0xc] = '\0';
  this->InitialBuffer[0xd] = '\0';
  this->InitialBuffer[0xe] = '\0';
  this->InitialBuffer[0xf] = '\0';
  this->BlockList = (BlockMeta *)this;
  return;
}

Assistant:

void reset() {
    while (BlockList) {
      BlockMeta* Tmp = BlockList;
      BlockList = BlockList->Next;
      if (reinterpret_cast<char*>(Tmp) != InitialBuffer)
        std::free(Tmp);
    }
    BlockList = new (InitialBuffer) BlockMeta{nullptr, 0};
  }